

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libeconf.c
# Opt level: O2

econf_err econf_getKeys(econf_file *kf,char *grp,size_t *length,char ***keys)

{
  size_t __nmemb;
  int iVar1;
  char *pcVar2;
  void *__ptr;
  char **ppcVar3;
  size_t sVar4;
  econf_err eVar5;
  size_t i_1;
  long lVar6;
  size_t i;
  size_t sVar7;
  long lVar8;
  
  if (length != (size_t *)0x0) {
    *length = 0;
  }
  if (kf == (econf_file *)0x0) {
    eVar5 = ECONF_ERROR;
  }
  else {
    if ((grp == (char *)0x0) || (*grp == '\0')) {
      grp = "_none_";
    }
    pcVar2 = strdup(grp);
    eVar5 = ECONF_NOMEM;
    if (pcVar2 != (char *)0x0) {
      __nmemb = kf->length;
      __ptr = calloc(__nmemb,1);
      if (__ptr == (void *)0x0) {
        free(pcVar2);
      }
      else {
        lVar6 = 0;
        sVar4 = 0;
        for (sVar7 = 0; __nmemb != sVar7; sVar7 = sVar7 + 1) {
          iVar1 = strcmp(*(char **)((long)&kf->file_entry->group + lVar6),pcVar2);
          if (iVar1 == 0) {
            *(undefined1 *)((long)__ptr + sVar7) = 1;
            sVar4 = sVar4 + 1;
          }
          lVar6 = lVar6 + 0x38;
        }
        free(pcVar2);
        if (sVar4 == 0) {
          free(__ptr);
          eVar5 = ECONF_NOKEY;
        }
        else {
          lVar6 = 8;
          ppcVar3 = (char **)calloc(sVar4 + 1,8);
          *keys = ppcVar3;
          if (ppcVar3 == (char **)0x0) {
            free(__ptr);
            eVar5 = ECONF_NOMEM;
          }
          else {
            lVar8 = 0;
            for (sVar7 = 0; __nmemb != sVar7; sVar7 = sVar7 + 1) {
              if (*(char *)((long)__ptr + sVar7) == '\x01') {
                pcVar2 = strdup(*(char **)((long)&kf->file_entry->group + lVar6));
                (*keys)[lVar8] = pcVar2;
                lVar8 = lVar8 + 1;
              }
              lVar6 = lVar6 + 0x38;
            }
            if (length != (size_t *)0x0) {
              *length = sVar4;
            }
            free(__ptr);
            eVar5 = ECONF_SUCCESS;
          }
        }
      }
    }
  }
  return eVar5;
}

Assistant:

econf_err
econf_getKeys(econf_file *kf, const char *grp, size_t *length, char ***keys)
{
  if (length != NULL)
    *length = 0; /* initialize */
  if (!kf)
    return ECONF_ERROR;

  size_t tmp = 0;
  char *group = (!grp || !*grp) ? strdup(KEY_FILE_NULL_VALUE) : strdup(grp);
  if (group == NULL)
    return ECONF_NOMEM;

  bool *uniques = calloc(kf->length, sizeof(bool));
  if (uniques == NULL)
    {
      free(group);
      return ECONF_NOMEM;
    }
  for (size_t i = 0; i < kf->length; i++) {
    if (!strcmp(kf->file_entry[i].group, group)) {
      uniques[i] = 1;
      tmp++;
    }
  }
  free(group);
  if (!tmp)
    {
      free (uniques);
      return ECONF_NOKEY;
    }
  *keys = calloc(tmp + 1, sizeof(char*));
  if (*keys == NULL) {
    free (uniques);
    return ECONF_NOMEM;
  }

  for (size_t i = 0, j = 0; i < kf->length; i++)
    if (uniques[i])
      (*keys)[j++] = strdup(kf->file_entry[i].key);

  if (length != NULL)
    *length = tmp;

  free(uniques);
  return ECONF_SUCCESS;
}